

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSubstitutionTree.hpp
# Opt level: O3

IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
* __thiscall
Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
getResultIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>>
          (IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
           *__return_storage_ptr__,
          LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this,Literal *lit,
          bool complementary,bool retrieveSubstitutions)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  Get<0U,_Ts> *value;
  Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>
  *extraout_RDX;
  Get<1U,_Ts> *value_00;
  Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>
  *extraout_RDX_00;
  Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>
  *is;
  Option<Lib::Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
  out;
  anon_class_24_3_b2e875d6 iter;
  long *local_108;
  Literal **local_100;
  SubstitutionTree **local_f8;
  OptionBase<Lib::Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
  local_f0;
  Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>
  local_cc;
  IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>_>_>
  local_ac;
  Literal *local_90;
  Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>
  local_84;
  OptionBase<Lib::Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
  local_64;
  SubstitutionTree *local_40;
  Literal *local_38;
  undefined1 local_30;
  
  local_90 = lit;
  local_40 = getTree(this,lit,complementary);
  local_f8 = &local_40;
  local_38 = lit;
  local_30 = retrieveSubstitutions;
  local_100 = &local_90;
  if (local_40->_root == (Node *)0x0) {
LAB_0034213f:
    local_f0._isSome = false;
    Lib::
    VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
    ::getEmpty();
    Lib::
    Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
    ::variant<0u>(&local_84,
                  (Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
                   *)&local_108,value);
    Lib::
    OptionBase<Lib::Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
    ::OptionBase(&local_64,&local_84);
    Lib::
    OptionBase<Lib::Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
    ::operator=(&local_f0,&local_64);
    Lib::
    OptionBase<Lib::Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
    ::~OptionBase(&local_64);
    Lib::CoproductImpl::
    RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
    ::
    switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>>::~DefaultImpl()::_lambda(auto:1)_1_>
              ((RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
                *)&local_84,(anon_class_8_1_8991fb9c)&local_84);
    if (local_108 != (long *)0x0) {
      plVar1 = local_108 + 1;
      *(int *)plVar1 = (int)*plVar1 + -1;
      if ((int)*plVar1 == 0) {
        (**(code **)(*local_108 + 8))();
      }
    }
    if ((local_f0._isSome & 1U) != 0) {
      bVar2 = true;
      Lib::CoproductImpl::TrivialOperations::CopyCons::
      DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>_>_>
      ::DefaultImpl(&local_cc._inner,
                    (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>_>_>
                     *)&local_f0._elem);
      is = extraout_RDX;
      goto LAB_003421ea;
    }
  }
  else {
    iVar3 = (*local_40->_root->_vptr_Node[3])();
    local_f0._isSome = false;
    if ((char)iVar3 != '\0') goto LAB_0034213f;
  }
  getResultIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>
  ::anon_class_16_2_20c24dd8::operator()(&local_ac,(anon_class_16_2_20c24dd8 *)&local_100);
  Lib::
  Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
  ::variant<1u>(&local_cc,
                (Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
                 *)&local_ac,value_00);
  bVar2 = false;
  is = extraout_RDX_00;
LAB_003421ea:
  Lib::
  coproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
            (__return_storage_ptr__,(Lib *)&local_cc,is);
  if (bVar2) {
    Lib::CoproductImpl::
    RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
    ::
    switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>>::~DefaultImpl()::_lambda(auto:1)_1_>
              ((RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
                *)&local_cc,(anon_class_8_1_8991fb9c)&local_cc);
  }
  else {
    Lib::CoproductImpl::
    RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
    ::
    switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>>::~DefaultImpl()::_lambda(auto:1)_1_>
              ((RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
                *)&local_cc,(anon_class_8_1_8991fb9c)&local_cc);
    Lib::CoproductImpl::
    RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>
    ::
    switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>::~DefaultImpl()::_lambda(auto:1)_1_>
              ((RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>
                *)&local_ac,(anon_class_8_1_8991fb9c)&local_ac);
  }
  Lib::
  OptionBase<Lib::Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
  ::~OptionBase(&local_f0);
  return __return_storage_ptr__;
}

Assistant:

auto getResultIterator(Literal* lit, bool complementary, bool retrieveSubstitutions, Args... args)
  {
    auto tree = &getTree(lit, complementary);

    auto iter = [tree, lit, retrieveSubstitutions, &args...](bool reversed) 
      { return tree->template iterator<Iterator>(lit, retrieveSubstitutions, reversed, args...); };

    return ifElseIter(
        tree->isEmpty(), [&]() { return VirtualIterator<ELEMENT_TYPE(Iterator)>::getEmpty(); },
                         [&]() { return ifElseIter(!lit->isEquality(),
                                 [&]() { return iter(/* reverse */ false); },
                                 [&]() { return concatIters(iter(/* reverse */ false), iter(/* reverse */ true)); }); }
        );
  }